

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeCommandListAppendMemoryPrefetch
          (ze_command_list_handle_t hCommandList,void *ptr,size_t size)

{
  ze_pfnCommandListAppendMemoryPrefetch_t pfnAppendMemoryPrefetch;
  ze_result_t result;
  size_t size_local;
  void *ptr_local;
  ze_command_list_handle_t hCommandList_local;
  
  pfnAppendMemoryPrefetch._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c3c8 != (code *)0x0) {
    pfnAppendMemoryPrefetch._4_4_ = (*DAT_0011c3c8)(hCommandList,ptr,size);
  }
  return pfnAppendMemoryPrefetch._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendMemoryPrefetch(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
        const void* ptr,                                ///< [in] pointer to start of the memory range to prefetch
        size_t size                                     ///< [in] size in bytes of the memory range to prefetch
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAppendMemoryPrefetch = context.zeDdiTable.CommandList.pfnAppendMemoryPrefetch;
        if( nullptr != pfnAppendMemoryPrefetch )
        {
            result = pfnAppendMemoryPrefetch( hCommandList, ptr, size );
        }
        else
        {
            // generic implementation
        }

        return result;
    }